

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_table.cpp
# Opt level: O2

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateTable(Transformer *this,PGCreateStmt *stmt)

{
  char cVar1;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var3;
  OnCreateConflict OVar4;
  pointer pCVar5;
  PGNode *pPVar6;
  PGColumnDef *pPVar7;
  ColumnDefinition *column;
  pointer pCVar8;
  NotImplementedException *pNVar9;
  ParserException *pPVar10;
  long in_RDX;
  Transformer *this_00;
  PGList *pPVar11;
  undefined8 *puVar12;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_280;
  optional_ptr<duckdb_libpgquery::PGColumnDef,_true> pg_col_def;
  undefined1 local_270 [8];
  optional_ptr<duckdb_libpgquery::PGNode,_true> node;
  __buckets_ptr local_258;
  optional_ptr<duckdb_libpgquery::PGConstraint,_true> pg_constraint_1;
  optional_ptr<duckdb_libpgquery::PGConstraint,_true> pg_constraint;
  QualifiedName qname;
  ColumnDefinition local_108;
  
  make_uniq<duckdb::CreateStatement>();
  make_uniq<duckdb::CreateTableInfo>();
  if (*(long *)(in_RDX + 0x18) != 0) {
    pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&pg_constraint,"inherited relations not implemented",(allocator *)&qname);
    NotImplementedException::NotImplementedException(pNVar9,(string *)&pg_constraint);
    __cxa_throw(pNVar9,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  ::std::__cxx11::string::assign((char *)&(pCVar5->super_CreateInfo).catalog);
  TransformQualifiedName(&qname,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar5->super_CreateInfo).catalog);
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar5->super_CreateInfo).schema);
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  this_00 = (Transformer *)&pCVar5->table;
  ::std::__cxx11::string::_M_assign((string *)this_00);
  OVar4 = TransformOnConflict(this_00,*(PGOnCreateConflict *)(in_RDX + 0x48));
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  (pCVar5->super_CreateInfo).on_conflict = OVar4;
  cVar1 = *(char *)(*(long *)(in_RDX + 8) + 0x21);
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  (pCVar5->super_CreateInfo).temporary = cVar1 == '\0';
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  if (((pCVar5->super_CreateInfo).temporary == true) && (1 < *(uint *)(in_RDX + 0x38))) {
    pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&pg_constraint,"Only ON COMMIT PRESERVE ROWS is supported",
               (allocator *)&node);
    NotImplementedException::NotImplementedException(pNVar9,(string *)&pg_constraint);
    __cxa_throw(pNVar9,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  puVar12 = *(undefined8 **)(in_RDX + 0x10);
  if (puVar12 == (undefined8 *)0x0) {
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&pg_constraint,"Table must have at least one column!",(allocator *)&node);
    ParserException::ParserException(pPVar10,(string *)&pg_constraint);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_258 = (__buckets_ptr)0x0;
  while( true ) {
    while( true ) {
      _Var3._M_head_impl = local_280._M_head_impl;
      puVar12 = (undefined8 *)puVar12[1];
      if (puVar12 == (undefined8 *)0x0) {
        if (local_258 != (__buckets_ptr)0x0) {
          local_280._M_head_impl = (CreateInfo *)0x0;
          pCVar8 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                   ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                                 *)this);
          _Var2._M_head_impl =
               (pCVar8->info).
               super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
               .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
          (pCVar8->info).
          super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
          super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
          super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = _Var3._M_head_impl;
          if (_Var2._M_head_impl != (CreateInfo *)0x0) {
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ParseInfo + 8))();
          }
          QualifiedName::~QualifiedName(&qname);
          if (local_280._M_head_impl != (CreateInfo *)0x0) {
            (*((local_280._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
          }
          return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>
                 )(unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>
                   )this;
        }
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&pg_constraint,"Table must have at least one column!",
                   (allocator *)&node);
        ParserException::ParserException(pPVar10,(string *)&pg_constraint);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      node.ptr = (PGNode *)*puVar12;
      pPVar6 = optional_ptr<duckdb_libpgquery::PGNode,_true>::operator->(&node);
      if (pPVar6->type != T_PGColumnDef) break;
      pg_col_def.ptr = (PGColumnDef *)*puVar12;
      pPVar7 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator*(&pg_col_def);
      TransformColumnDefinition((ColumnDefinition *)&pg_constraint,(Transformer *)stmt,pPVar7);
      pPVar7 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->(&pg_col_def);
      if (pPVar7->constraints != (PGList *)0x0) {
        pPVar7 = optional_ptr<duckdb_libpgquery::PGColumnDef,_true>::operator->(&pg_col_def);
        pPVar11 = pPVar7->constraints;
        while (pPVar11 = (PGList *)pPVar11->head, pPVar11 != (PGList *)0x0) {
          pg_constraint_1.ptr = *(PGConstraint **)pPVar11;
          column = (ColumnDefinition *)
                   optional_ptr<duckdb_libpgquery::PGConstraint,_true>::operator*(&pg_constraint_1);
          unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
          operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                      *)&local_280);
          TransformConstraint((Transformer *)local_270,(PGConstraint *)stmt,column,
                              (idx_t)&pg_constraint);
          if (local_270 != (undefined1  [8])0x0) {
            pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                     ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                                   *)&local_280);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                        *)&pCVar5->constraints,
                       (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                        *)local_270);
            if (local_270 != (undefined1  [8])0x0) {
              (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_270)->ptr->options)();
            }
          }
        }
      }
      pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_280);
      ColumnDefinition::ColumnDefinition(&local_108,(ColumnDefinition *)&pg_constraint);
      ColumnList::AddColumn(&pCVar5->columns,&local_108);
      ColumnDefinition::~ColumnDefinition(&local_108);
      local_258 = (__buckets_ptr)((long)local_258 + 1);
      ColumnDefinition::~ColumnDefinition((ColumnDefinition *)&pg_constraint);
    }
    if (pPVar6->type != T_PGConstraint) break;
    pg_constraint.ptr = (PGConstraint *)*puVar12;
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_280);
    optional_ptr<duckdb_libpgquery::PGConstraint,_true>::operator*(&pg_constraint);
    TransformConstraint((Transformer *)&pg_col_def,(PGConstraint *)stmt);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar5->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &pg_col_def);
    if (pg_col_def.ptr != (PGColumnDef *)0x0) {
      (**(code **)(*(long *)pg_col_def.ptr + 8))();
    }
  }
  pNVar9 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&pg_constraint,"ColumnDef type not handled yet",(allocator *)&pg_col_def);
  NotImplementedException::NotImplementedException(pNVar9,(string *)&pg_constraint);
  __cxa_throw(pNVar9,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateTable(duckdb_libpgquery::PGCreateStmt &stmt) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateTableInfo>();

	if (stmt.inhRelations) {
		throw NotImplementedException("inherited relations not implemented");
	}
	D_ASSERT(stmt.relation);

	info->catalog = INVALID_CATALOG;
	auto qname = TransformQualifiedName(*stmt.relation);
	info->catalog = qname.catalog;
	info->schema = qname.schema;
	info->table = qname.name;
	info->on_conflict = TransformOnConflict(stmt.onconflict);
	info->temporary =
	    stmt.relation->relpersistence == duckdb_libpgquery::PGPostgresRelPersistence::PG_RELPERSISTENCE_TEMP;

	if (info->temporary && stmt.oncommit != duckdb_libpgquery::PGOnCommitAction::PG_ONCOMMIT_PRESERVE_ROWS &&
	    stmt.oncommit != duckdb_libpgquery::PGOnCommitAction::PG_ONCOMMIT_NOOP) {
		throw NotImplementedException("Only ON COMMIT PRESERVE ROWS is supported");
	}
	if (!stmt.tableElts) {
		throw ParserException("Table must have at least one column!");
	}

	idx_t column_count = 0;
	for (auto c = stmt.tableElts->head; c != nullptr; c = lnext(c)) {
		auto node = PGPointerCast<duckdb_libpgquery::PGNode>(c->data.ptr_value);
		switch (node->type) {
		case duckdb_libpgquery::T_PGColumnDef: {
			auto pg_col_def = PGPointerCast<duckdb_libpgquery::PGColumnDef>(c->data.ptr_value);
			auto col_def = TransformColumnDefinition(*pg_col_def);

			if (pg_col_def->constraints) {
				for (auto cell = pg_col_def->constraints->head; cell != nullptr; cell = cell->next) {
					auto pg_constraint = PGPointerCast<duckdb_libpgquery::PGConstraint>(cell->data.ptr_value);
					auto constraint = TransformConstraint(*pg_constraint, col_def, info->columns.LogicalColumnCount());
					if (constraint) {
						info->constraints.push_back(std::move(constraint));
					}
				}
			}

			info->columns.AddColumn(std::move(col_def));
			column_count++;
			break;
		}
		case duckdb_libpgquery::T_PGConstraint: {
			auto pg_constraint = PGPointerCast<duckdb_libpgquery::PGConstraint>(c->data.ptr_value);
			info->constraints.push_back(TransformConstraint(*pg_constraint));
			break;
		}
		default:
			throw NotImplementedException("ColumnDef type not handled yet");
		}
	}

	if (!column_count) {
		throw ParserException("Table must have at least one column!");
	}

	result->info = std::move(info);
	return result;
}